

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

uint64_t __thiscall r_comp::Decompiler::decompile_references(Decompiler *this,Image *image)

{
  SysObject *__k;
  SysObject *pSVar1;
  Metadata *this_00;
  key_type kVar2;
  ushort uVar3;
  mapped_type *pmVar4;
  SysObject **ppSVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  uint __len;
  size_t i;
  uint __val;
  _Hash_node_base *p_Var9;
  uint64_t uVar10;
  __hashtable *__h;
  Class *c;
  string __str;
  string name;
  unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
  object_ID_per_class;
  key_type local_d4;
  undefined2 local_d2;
  Class *local_d0;
  Decompiler *local_c8;
  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_c0 [2];
  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  local_b0 [16];
  _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_98;
  CodeSegment *local_90;
  undefined1 local_88 [32];
  _Hashtable<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var9 = (this->metadata->sys_classes)._M_h._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    do {
      local_88._0_8_ = p_Var9 + 5;
      pmVar4 = std::__detail::
               _Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)local_88);
      *pmVar4 = 0;
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = 0;
  local_88[0x10] = '\0';
  this->image = image;
  local_d4 = 0;
  if ((image->code_segment).objects.m_vector.
      super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (image->code_segment).objects.m_vector.
      super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    this->closing_set = false;
  }
  else {
    local_90 = &image->code_segment;
    local_98 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&image->object_names;
    local_a0 = (_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->object_names;
    i = 0;
    local_c8 = this;
    do {
      ppSVar5 = r_code::vector<r_code::SysObject_*>::operator[](&local_90->objects,i);
      pSVar1 = *ppSVar5;
      __k = pSVar1 + 0x68;
      iVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_98,(key_type_conflict *)__k);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_00 = local_c8->metadata;
        r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pSVar1 + 8),0);
        uVar3 = r_code::Atom::asOpcode();
        local_d0 = Metadata::get_class(this_00,(ulong)uVar3);
        pmVar4 = std::__detail::
                 _Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_d0);
        uVar3 = *pmVar4;
        __val = (uint)uVar3;
        pmVar4 = std::__detail::
                 _Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_d0);
        *pmVar4 = uVar3 + 1;
        std::__cxx11::string::_M_assign((string *)local_88);
        __len = 1;
        if (((9 < uVar3) && (__len = 2, 99 < uVar3)) && (__len = 3, 999 < __val)) {
          __len = 5 - (__val < 10000);
        }
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct((ulong)local_c0,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0[0],__len,__val);
        std::__cxx11::string::_M_append((char *)local_88,(ulong)local_c0[0]);
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0]);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_88);
        local_d2 = *(undefined2 *)__k;
        local_c0[0] = (_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)&this->named_objects;
        std::
        _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_short,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                  ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->named_objects,&local_d2,local_c0);
      }
      pmVar7 = std::__detail::
               _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_a0,&local_d4);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      kVar2 = local_d4;
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->object_indices,(key_type *)local_88);
      *pmVar8 = kVar2;
      local_d4 = local_d4 + 1;
      i = (size_t)local_d4;
      uVar10 = (long)(image->code_segment).objects.m_vector.
                     super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(image->code_segment).objects.m_vector.
                     super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
    } while (i < uVar10);
    local_c8->closing_set = false;
    if ((key_type)local_88._0_8_ != (key_type)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  std::
  _Hashtable<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return uVar10;
}

Assistant:

uint64_t Decompiler::decompile_references(r_comp::Image *image)
{
    std::unordered_map<const Class *, uint16_t> object_ID_per_class;

    for (const std::pair<const std::string, Class> &c : metadata->sys_classes) {
        object_ID_per_class[&c.second] = 0;
    }

    std::string name;
    this->image = image;
    // populate object names first so they can be referenced in any order.
    Class *c;
    uint16_t last_object_ID;

    for (uint16_t i = 0; i < image->code_segment.objects.size(); ++i) {
        SysObject *sys_object = (SysObject *)image->code_segment.objects[i];
        const auto iterator = image->object_names.symbols.find(sys_object->oid);

        if (iterator != image->object_names.symbols.end()) {
            name = iterator->second;
            named_objects.insert(sys_object->oid);
        } else {
            c = metadata->get_class(sys_object->code[0].asOpcode());
            last_object_ID = object_ID_per_class[c];
            object_ID_per_class[c] = last_object_ID + 1;
            name = c->str_opcode;
            name += std::to_string(last_object_ID);
        }

        object_names[i] = name;
        object_indices[name] = i;
    }

    closing_set = false;
    return image->code_segment.objects.size();
}